

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsObjectDefineProperty
          (JsValueRef object,JsValueRef propertyId,JsValueRef propertyDescriptor,bool *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JsErrorCode JVar5;
  JsrtContext *pJVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_70 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar6 = JsrtContext::GetCurrent();
  if (pJVar6 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  scriptContext = (((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_a8 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_70,scriptContext,(ScriptEntryExitRecord *)auStack_a8,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_70);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x7c7,"(false)","Need to implement support here!!!");
    if (!bVar3) goto LAB_003791e6;
    *puVar7 = 0;
  }
  if (object == (JsValueRef)0x0) {
LAB_00378ebc:
    JVar5 = JsErrorInvalidArgument;
  }
  else {
    BVar4 = Js::JavascriptOperators::IsObject(object);
    JVar5 = JsErrorArgumentNotObject;
    if (BVar4 != 0) {
      pRVar8 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar5 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00378ec2;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar8,false);
      }
      if ((ulong)propertyId >> 0x30 != 0 || propertyId == (JsValueRef)0x0) goto LAB_00378ebc;
      pRVar8 = Js::VarTo<Js::RecyclableObject>(propertyId);
      pSVar1 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar5 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00378ec2;
        propertyId = Js::CrossSite::MarshalVar(scriptContext,pRVar8,false);
      }
      JVar5 = JsErrorInvalidArgument;
      if (propertyDescriptor != (JsValueRef)0x0) {
        BVar4 = Js::JavascriptOperators::IsObject(propertyDescriptor);
        JVar5 = JsErrorArgumentNotObject;
        if (BVar4 != 0) {
          pRVar8 = Js::VarTo<Js::RecyclableObject>(propertyDescriptor);
          pSVar1 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr;
          if (pSVar1 != scriptContext) {
            JVar5 = JsErrorWrongRuntime;
            if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00378ec2;
            propertyDescriptor = Js::CrossSite::MarshalVar(scriptContext,pRVar8,false);
          }
          if (result == (bool *)0x0) {
            JVar5 = JsErrorNullArgument;
          }
          else {
            *result = false;
            __enterScriptObject.library = (JavascriptLibrary *)0x0;
            pRVar8 = Js::VarTo<Js::RecyclableObject>(propertyId);
            JVar5 = InternalGetPropertyRecord
                              (scriptContext,pRVar8,(PropertyRecord **)&__enterScriptObject.library)
            ;
            if (JVar5 == JsNoError) {
              JVar5 = JsDefinePropertyCommon
                                (scriptContext,object,(PropertyRecord *)__enterScriptObject.library,
                                 propertyDescriptor,result);
            }
          }
        }
      }
    }
  }
LAB_00378ec2:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_70);
  if ((int)JVar5 < 0x20001) {
    if ((6 < JVar5 - JsErrorNoCurrentContext) ||
       ((0x43U >> (JVar5 - JsErrorNoCurrentContext & 0x1f) & 1) == 0)) goto LAB_00378f70;
  }
  else if ((int)JVar5 < 0x30003) {
    if ((JVar5 != JsErrorOutOfMemory) && (JVar5 != JsErrorScriptException)) goto LAB_00378f70;
  }
  else if ((JVar5 != JsErrorFatal) && (JVar5 != JsErrorScriptTerminated)) goto LAB_00378f70;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar7 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                     ,0xcc,
                     "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                     ,
                     "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                    );
  if (!bVar3) {
LAB_003791e6:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar7 = 0;
LAB_00378f70:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  return JVar5;
}

Assistant:

CHAKRA_API JsObjectDefineProperty(_In_ JsValueRef object, _In_ JsValueRef propertyId,
    _In_ JsValueRef propertyDescriptor, _Out_ bool *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        VALIDATE_INCOMING_OBJECT(propertyDescriptor, scriptContext);
        PARAM_NOT_NULL(result);
        *result = false;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        return JsDefinePropertyCommon(scriptContext, object, propertyRecord, propertyDescriptor, result);
    });
}